

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

CTcPrsNode * __thiscall CTcPrsOpBinGroup::parse(CTcPrsOpBinGroup *this)

{
  int iVar1;
  long in_RDI;
  CTcPrsNode **unaff_retaddr;
  CTcPrsOpBinGroup *in_stack_00000008;
  CTcPrsNode *lhs;
  CTcPrsNode *local_8;
  
  local_8 = (CTcPrsNode *)(**(code **)**(undefined8 **)(in_RDI + 8))();
  if (local_8 == (CTcPrsNode *)0x0) {
    local_8 = (CTcPrsNode *)0x0;
  }
  else {
    do {
      iVar1 = find_and_apply_op(in_stack_00000008,unaff_retaddr);
    } while (iVar1 != 0);
  }
  return local_8;
}

Assistant:

CTcPrsNode *CTcPrsOpBinGroup::parse() const
{
    /* parse our left side - if that fails, return failure */
    CTcPrsNode *lhs = left_->parse();
    if (lhs == 0)
        return 0;

    /* keep going as long as we find one of our operators */
    while (find_and_apply_op(&lhs)) ;

    /* return the expression tree */
    return lhs;
}